

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

attr_list attr_list_from_string(char *str)

{
  uchar *output;
  attr_list p_Var1;
  
  if (str != (char *)0x0) {
    output = (uchar *)strdup(str);
    base64_decode((uchar *)str,output);
    p_Var1 = decode_attr_from_xmit(output);
    free(output);
    return p_Var1;
  }
  return (attr_list)0x0;
}

Assistant:

extern
attr_list
attr_list_from_string(const char * str)
{
    attr_list ret_val;
    unsigned char *output;
    if (str == NULL) return NULL;

    output = (unsigned char *)strdup(str);
    base64_decode((unsigned char *)str, output);
    ret_val = decode_attr_from_xmit(output);
    free(output);
    return ret_val;
}